

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

void __thiscall
yy::mylanguage_parser::yypush_(mylanguage_parser *this,char *m,stack_symbol_type *sym)

{
  ostream *poVar1;
  size_t sVar2;
  char local_2a [2];
  
  if ((m != (char *)0x0) && (this->yydebug_ != 0)) {
    poVar1 = this->yycdebug_;
    sVar2 = strlen(m);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,m,sVar2);
    local_2a[1] = 0x20;
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_2a + 1,1);
    yy_print_<yy::mylanguage_parser::by_state>
              (this,this->yycdebug_,&sym->super_basic_symbol<yy::mylanguage_parser::by_state>);
    local_2a[0] = '\n';
    std::__ostream_insert<char,std::char_traits<char>>(this->yycdebug_,local_2a,1);
  }
  stack<yy::mylanguage_parser::stack_symbol_type,_std::vector<yy::mylanguage_parser::stack_symbol_type,_std::allocator<yy::mylanguage_parser::stack_symbol_type>_>_>
  ::push(&this->yystack_,sym);
  return;
}

Assistant:

void
  mylanguage_parser::yypush_ (const char* m, YY_MOVE_REF (stack_symbol_type) sym)
  {
    if (m)
      YY_SYMBOL_PRINT (m, sym);
    yystack_.push (YY_MOVE (sym));
  }